

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O2

uint64_t __thiscall
ami_nvar_t::nvar_entry_body_t::extended_header_timestamp(nvar_entry_body_t *this)

{
  nvar_attributes_t *pnVar1;
  kstream *this_00;
  uint16_t uVar2;
  nvar_extended_attributes_t *pnVar3;
  uint64_t pos;
  uint64_t uVar4;
  
  if (this->f_extended_header_timestamp == false) {
    this->n_extended_header_timestamp = true;
    pnVar1 = (this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
    if ((pnVar1->m_valid == true) && (pnVar1->m_extended_header == true)) {
      uVar2 = extended_header_size(this);
      if (10 < uVar2) {
        pnVar3 = extended_header_attributes(this);
        if (pnVar3->m_time_based_auth == true) {
          this->n_extended_header_timestamp = false;
          pos = kaitai::kstream::pos((this->super_kstruct).m__io);
          this_00 = (this->super_kstruct).m__io;
          uVar4 = kaitai::kstream::pos(this_00);
          uVar2 = extended_header_size(this);
          kaitai::kstream::seek(this_00,(uVar4 - uVar2) + 1);
          uVar4 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
          this->m_extended_header_timestamp = uVar4;
          kaitai::kstream::seek((this->super_kstruct).m__io,pos);
          this->f_extended_header_timestamp = true;
        }
      }
    }
  }
  return this->m_extended_header_timestamp;
}

Assistant:

uint64_t ami_nvar_t::nvar_entry_body_t::extended_header_timestamp() {
    if (f_extended_header_timestamp)
        return m_extended_header_timestamp;
    n_extended_header_timestamp = true;
    if ( ((_parent()->attributes()->valid()) && (_parent()->attributes()->extended_header()) && (extended_header_size() >= ((1 + 8) + 2)) && (extended_header_attributes()->time_based_auth())) ) {
        n_extended_header_timestamp = false;
        std::streampos _pos = m__io->pos();
        m__io->seek(((_io()->pos() - extended_header_size()) + 1));
        m_extended_header_timestamp = m__io->read_u8le();
        m__io->seek(_pos);
        f_extended_header_timestamp = true;
    }
    return m_extended_header_timestamp;
}